

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O2

idx_t duckdb::TemplatedMatch<true,duckdb::hugeint_t,duckdb::Equals>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  long lVar7;
  sel_t *psVar8;
  bool bVar9;
  const_reference pvVar10;
  idx_t iVar11;
  SelectionVector *pSVar12;
  idx_t iVar13;
  uint uVar14;
  idx_t i_1;
  idx_t i;
  idx_t iVar15;
  ValidityMask *lhs_validity;
  idx_t local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  long local_38;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar2 = (lhs_format->unified).sel;
  pdVar3 = (lhs_format->unified).data;
  pdVar4 = rhs_row_locations->data;
  pvVar10 = vector<unsigned_long,_true>::get<true>(&rhs_layout->offsets,col_idx);
  uVar14 = 1 << ((byte)col_idx & 7);
  vVar5 = *pvVar10;
  if (puVar1 == (unsigned_long *)0x0) {
    local_78 = 0;
    for (iVar15 = 0; count != iVar15; iVar15 = iVar15 + 1) {
      psVar6 = sel->sel_vector;
      iVar13 = iVar15;
      if (psVar6 != (sel_t *)0x0) {
        iVar13 = (idx_t)psVar6[iVar15];
      }
      psVar8 = pSVar2->sel_vector;
      iVar11 = iVar13;
      if (psVar8 != (sel_t *)0x0) {
        iVar11 = (idx_t)psVar8[iVar13];
      }
      lVar7 = *(long *)(pdVar4 + iVar13 * 8);
      local_38 = ((long)(rhs_layout->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(rhs_layout->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((((uVar14 & *(byte *)(lVar7 + (col_idx >> 3))) == 0) ||
          (*(long *)(pdVar3 + iVar11 * 0x10) != *(long *)(lVar7 + vVar5))) ||
         (*(long *)(pdVar3 + iVar11 * 0x10 + 8) != *(long *)(lVar7 + 8 + vVar5))) {
        iVar11 = *no_match_count;
        *no_match_count = iVar11 + 1;
        no_match_sel->sel_vector[iVar11] = (sel_t)iVar13;
      }
      else {
        psVar6[local_78] = (sel_t)iVar13;
        local_78 = local_78 + 1;
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
    }
  }
  else {
    local_78 = 0;
    for (iVar15 = 0; count != iVar15; iVar15 = iVar15 + 1) {
      iVar13 = iVar15;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar13 = (idx_t)sel->sel_vector[iVar15];
      }
      psVar6 = pSVar2->sel_vector;
      iVar11 = iVar13;
      if (psVar6 != (sel_t *)0x0) {
        iVar11 = (idx_t)psVar6[iVar13];
      }
      bVar9 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>,
                         iVar11);
      lVar7 = *(long *)(pdVar4 + iVar13 * 8);
      local_38 = ((long)(rhs_layout->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(rhs_layout->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (((bVar9) && ((*(byte *)(lVar7 + (col_idx >> 3)) & uVar14) != 0)) &&
         ((*(long *)(pdVar3 + iVar11 * 0x10) == *(long *)(lVar7 + vVar5) &&
          (*(long *)(pdVar3 + iVar11 * 0x10 + 8) == *(long *)(lVar7 + 8 + vVar5))))) {
        iVar11 = local_78;
        pSVar12 = sel;
        local_78 = local_78 + 1;
      }
      else {
        iVar11 = *no_match_count;
        *no_match_count = iVar11 + 1;
        pSVar12 = no_match_sel;
      }
      pSVar12->sel_vector[iVar11] = (sel_t)iVar13;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
    }
  }
  return local_78;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}